

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O3

int Abc_NodeIsTravIdCurrent(Abc_Obj_t *p)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  
  pAVar2 = p->pNtk;
  uVar1 = p->Id;
  uVar3 = (pAVar2->vTravIds).nSize;
  if ((int)uVar1 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
    goto LAB_00475bb6;
  }
  uVar5 = (long)(int)uVar1 + 1;
  iVar6 = (pAVar2->vTravIds).nCap;
  if ((int)uVar1 < iVar6 * 2) {
    if (iVar6 <= (int)uVar1) {
      piVar4 = (pAVar2->vTravIds).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar6 << 3);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)iVar6 << 3);
      }
      (pAVar2->vTravIds).pArray = piVar4;
      iVar6 = iVar6 * 2;
LAB_00475b71:
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar6;
      uVar3 = (pAVar2->vTravIds).nSize;
    }
  }
  else if (iVar6 <= (int)uVar1) {
    piVar4 = (pAVar2->vTravIds).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(uVar5 * 4);
    }
    else {
      piVar4 = (int *)realloc(piVar4,uVar5 * 4);
    }
    (pAVar2->vTravIds).pArray = piVar4;
    iVar6 = (int)uVar5;
    goto LAB_00475b71;
  }
  if ((int)uVar3 <= (int)uVar1) {
    memset((pAVar2->vTravIds).pArray + (int)uVar3,0,(ulong)(uVar1 - uVar3) * 4 + 4);
  }
  (pAVar2->vTravIds).nSize = (int)uVar5;
LAB_00475bb6:
  if ((-1 < (int)uVar1) && ((int)uVar1 < (int)uVar5)) {
    return (int)((pAVar2->vTravIds).pArray[uVar1] == p->pNtk->nTravIds);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int         Abc_NodeIsTravIdCurrent( Abc_Obj_t * p )          { return (Abc_NodeTravId(p) == Abc_ObjNtk(p)->nTravIds);                                }